

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  functest *pp_Var4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  _xmlFree = 0;
  _xmlMalloc = 0;
  _xmlRealloc = 0;
  _xmlMemStrdup = 0;
  xmlInitParser();
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  iVar6 = 1;
  setenv("XML_CATALOG_FILES","",1);
  xmlInitializeCatalog();
  xmlRelaxNGInitTypes();
  xmlSchemaInitTypes();
  iVar5 = 0;
  do {
    if (argc <= iVar6) {
      if (iVar5 == 0) {
        for (lVar3 = 0; lVar3 != 0x36; lVar3 = lVar3 + 1) {
          runtest((int)lVar3);
        }
      }
      bVar7 = nb_errors != 0 || nb_leaks != 0;
      if (bVar7) {
        printf("Total %d tests, %d errors, %d leaks\n",(ulong)(uint)nb_tests);
      }
      else {
        printf("Total %d tests, no errors\n",(ulong)(uint)nb_tests);
      }
      xmlCleanupParser();
      return (uint)bVar7;
    }
    pcVar2 = argv[iVar6];
    if (*pcVar2 == '-') {
      if ((pcVar2[1] == 'v') && (pcVar2[2] == '\0')) {
        verbose = 1;
      }
      else {
        if ((pcVar2[1] != 'u') || (pcVar2[2] != '\0')) goto LAB_00107f19;
        update_results = 1;
      }
    }
    else {
LAB_00107f19:
      iVar1 = strcmp(pcVar2,"-quiet");
      if (iVar1 == 0) {
        tests_quiet = 1;
      }
      else {
        iVar1 = strcmp(pcVar2,"--out");
        if (iVar1 == 0) {
          temp_directory = argv[(long)iVar6 + 1];
          iVar6 = iVar6 + 1;
        }
        else {
          iVar1 = 0;
          for (pp_Var4 = &testDescriptions[0].func; *pp_Var4 != (functest)0x0; pp_Var4 = pp_Var4 + 7
              ) {
            pcVar2 = strstr(((testDesc *)(pp_Var4 + -1))->desc,argv[iVar6]);
            if (pcVar2 != (char *)0x0) {
              runtest(iVar1);
              iVar5 = iVar5 + 1;
            }
            iVar1 = iVar1 + 1;
          }
        }
      }
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

int
main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    int i, a, ret = 0;
    int subset = 0;

#if defined(_WIN32)
    setvbuf(stdout, NULL, _IONBF, 0);
    setvbuf(stderr, NULL, _IONBF, 0);
#endif

#if defined(_MSC_VER) && _MSC_VER >= 1400 && _MSC_VER < 1900
    _set_output_format(_TWO_DIGIT_EXPONENT);
#endif

    initializeLibxml2();

    for (a = 1; a < argc;a++) {
        if (!strcmp(argv[a], "-v"))
	    verbose = 1;
        else if (!strcmp(argv[a], "-u"))
	    update_results = 1;
        else if (!strcmp(argv[a], "-quiet"))
	    tests_quiet = 1;
        else if (!strcmp(argv[a], "--out"))
	    temp_directory = argv[++a];
	else {
	    for (i = 0; testDescriptions[i].func != NULL; i++) {
	        if (strstr(testDescriptions[i].desc, argv[a])) {
		    ret += runtest(i);
		    subset++;
		}
	    }
	}
    }
    if (subset == 0) {
	for (i = 0; testDescriptions[i].func != NULL; i++) {
	    ret += runtest(i);
	}
    }
    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
        ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
    }
    xmlCleanupParser();

    return(ret);
}